

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::RollupOutput::PrintRowToCSV
          (RollupOutput *this,RollupRow *row,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parent_labels,ostream *out,bool tabs,bool csvDiff)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  ulong uVar8;
  char *__end;
  ulong uVar9;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  RollupRow *local_68;
  undefined4 local_60;
  undefined4 local_5c;
  ostream *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_5c = (undefined4)CONCAT71(in_register_00000081,tabs);
  local_68 = row;
  local_58 = out;
  if ((ulong)((long)(parent_labels->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(parent_labels->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) <
      (ulong)((long)(this->source_names_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->source_names_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)) {
    do {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,anon_var_dwarf_3cded8 + 0x11,anon_var_dwarf_3cded8 + 0x11);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
                 &local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    } while ((ulong)((long)(parent_labels->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(parent_labels->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) <
             (ulong)((long)(this->source_names_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->source_names_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start));
  }
  uVar9 = (local_68->size).vm;
  uVar8 = -uVar9;
  if (0 < (long)uVar9) {
    uVar8 = uVar9;
  }
  uVar6 = 1;
  if (9 < uVar8) {
    uVar4 = uVar8;
    uVar2 = 4;
    do {
      uVar6 = uVar2;
      if (uVar4 < 100) {
        uVar6 = uVar6 - 2;
        goto LAB_0016f41b;
      }
      if (uVar4 < 1000) {
        uVar6 = uVar6 - 1;
        goto LAB_0016f41b;
      }
      if (uVar4 < 10000) goto LAB_0016f41b;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      uVar2 = uVar6 + 4;
    } while (bVar1);
    uVar6 = uVar6 + 1;
  }
LAB_0016f41b:
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_60 = CONCAT31(in_register_00000089,csvDiff);
  std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar6 - (char)((long)uVar9 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_88._M_dataplus._M_p + -((long)uVar9 >> 0x3f),uVar6,uVar8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
             &local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  uVar9 = (local_68->size).file;
  uVar8 = -uVar9;
  if (0 < (long)uVar9) {
    uVar8 = uVar9;
  }
  uVar6 = 1;
  if (9 < uVar8) {
    uVar4 = uVar8;
    uVar2 = 4;
    do {
      uVar6 = uVar2;
      if (uVar4 < 100) {
        uVar6 = uVar6 - 2;
        goto LAB_0016f4e1;
      }
      if (uVar4 < 1000) {
        uVar6 = uVar6 - 1;
        goto LAB_0016f4e1;
      }
      if (uVar4 < 10000) goto LAB_0016f4e1;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      uVar2 = uVar6 + 4;
    } while (bVar1);
    uVar6 = uVar6 + 1;
  }
LAB_0016f4e1:
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar6 - (char)((long)uVar9 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_88._M_dataplus._M_p + -((long)uVar9 >> 0x3f),uVar6,uVar8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
             &local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_60 != '\0') {
    uVar9 = (local_68->old_size).vm;
    uVar8 = -uVar9;
    if (0 < (long)uVar9) {
      uVar8 = uVar9;
    }
    uVar6 = 1;
    if (9 < uVar8) {
      uVar4 = uVar8;
      uVar2 = 4;
      do {
        uVar6 = uVar2;
        if (uVar4 < 100) {
          uVar6 = uVar6 - 2;
          goto LAB_0016f5b1;
        }
        if (uVar4 < 1000) {
          uVar6 = uVar6 - 1;
          goto LAB_0016f5b1;
        }
        if (uVar4 < 10000) goto LAB_0016f5b1;
        bVar1 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        uVar2 = uVar6 + 4;
      } while (bVar1);
      uVar6 = uVar6 + 1;
    }
LAB_0016f5b1:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar6 - (char)((long)uVar9 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_88._M_dataplus._M_p + -((long)uVar9 >> 0x3f),uVar6,uVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
               &local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    uVar9 = (local_68->old_size).file;
    uVar8 = -uVar9;
    if (0 < (long)uVar9) {
      uVar8 = uVar9;
    }
    uVar6 = 1;
    if (9 < uVar8) {
      uVar4 = uVar8;
      uVar2 = 4;
      do {
        uVar6 = uVar2;
        if (uVar4 < 100) {
          uVar6 = uVar6 - 2;
          goto LAB_0016f678;
        }
        if (uVar4 < 1000) {
          uVar6 = uVar6 - 1;
          goto LAB_0016f678;
        }
        if (uVar4 < 10000) goto LAB_0016f678;
        bVar1 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        uVar2 = uVar6 + 4;
      } while (bVar1);
      uVar6 = uVar6 + 1;
    }
LAB_0016f678:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar6 - (char)((long)uVar9 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_88._M_dataplus._M_p + -((long)uVar9 >> 0x3f),uVar6,uVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
               &local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    uVar8 = (local_68->size).vm + (local_68->old_size).vm;
    uVar9 = -uVar8;
    if (0 < (long)uVar8) {
      uVar9 = uVar8;
    }
    uVar6 = 1;
    if (9 < uVar9) {
      uVar4 = uVar9;
      uVar2 = 4;
      do {
        uVar6 = uVar2;
        if (uVar4 < 100) {
          uVar6 = uVar6 - 2;
          goto LAB_0016f73d;
        }
        if (uVar4 < 1000) {
          uVar6 = uVar6 - 1;
          goto LAB_0016f73d;
        }
        if (uVar4 < 10000) goto LAB_0016f73d;
        bVar1 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        uVar2 = uVar6 + 4;
      } while (bVar1);
      uVar6 = uVar6 + 1;
    }
LAB_0016f73d:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar6 - (char)((long)uVar8 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_88._M_dataplus._M_p + -((long)uVar8 >> 0x3f),uVar6,uVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
               &local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    uVar8 = (local_68->size).file + (local_68->old_size).file;
    uVar9 = -uVar8;
    if (0 < (long)uVar8) {
      uVar9 = uVar8;
    }
    uVar6 = 1;
    if (9 < uVar9) {
      uVar4 = uVar9;
      uVar2 = 4;
      do {
        uVar6 = uVar2;
        if (uVar4 < 100) {
          uVar6 = uVar6 - 2;
          goto LAB_0016f801;
        }
        if (uVar4 < 1000) {
          uVar6 = uVar6 - 1;
          goto LAB_0016f801;
        }
        if (uVar4 < 10000) goto LAB_0016f801;
        bVar1 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        uVar2 = uVar6 + 4;
      } while (bVar1);
      uVar6 = uVar6 + 1;
    }
LAB_0016f801:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar6 - (char)((long)uVar8 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_88._M_dataplus._M_p + -((long)uVar8 >> 0x3f),uVar6,uVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
               &local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar7 = ",";
  if ((char)local_5c != '\0') {
    pcVar7 = anon_var_dwarf_3394d6 + 0x11;
  }
  pcVar5 = "";
  if ((char)local_5c != '\0') {
    pcVar5 = anon_var_dwarf_3394d6 + 0x12;
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar7,pcVar5);
  absl::strings_internal::
  JoinAlgorithm<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            (&local_50,
             (strings_internal *)
             (parent_labels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (parent_labels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,local_88._M_string_length,
             local_88._M_dataplus._M_p);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_58,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RollupOutput::PrintRowToCSV(const RollupRow& row,
                                 std::vector<std::string> parent_labels,
                                 std::ostream* out, bool tabs, bool csvDiff) const {
  while (parent_labels.size() < source_names_.size()) {
    // If this label had no data at this level, append an empty string.
    parent_labels.push_back("");
  }

  parent_labels.push_back(std::to_string(row.size.vm));
  parent_labels.push_back(std::to_string(row.size.file));

  // If in diff where both old size are 0, get new size by adding diff size to
  // old size.
  if (csvDiff) {
    parent_labels.push_back(std::to_string(row.old_size.vm));
  	parent_labels.push_back(std::to_string(row.old_size.file));
    parent_labels.push_back(std::to_string(row.old_size.vm + (row.size.vm)));
    parent_labels.push_back(
        std::to_string(row.old_size.file + (row.size.file)));}

  std::string sep = tabs ? "\t" : ",";
  *out << absl::StrJoin(parent_labels, sep) << "\n";
}